

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O2

void llvm::sys::path::append
               (SmallVectorImpl<char> *path,Style style,Twine *a,Twine *b,Twine *c,Twine *d)

{
  ulong uVar1;
  undefined1 uVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  size_type sVar6;
  char *in_end;
  long lVar7;
  char *in_start;
  StringRef *component;
  StringRef *this;
  bool bVar8;
  StringRef Chars;
  StringRef local_160;
  char *local_148;
  SmallVector<llvm::StringRef,_4U> components;
  SmallString<32U> d_storage;
  SmallString<32U> c_storage;
  SmallString<32U> b_storage;
  SmallString<32U> a_storage;
  
  a_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &a_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>;
  a_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  a_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x20;
  b_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &b_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>;
  b_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  b_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x20;
  c_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &c_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>;
  c_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  c_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x20;
  d_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &d_storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>;
  d_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  d_storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x20;
  components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX =
       &components.super_SmallVectorStorage<llvm::StringRef,_4U>;
  components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  components.super_SmallVectorImpl<llvm::StringRef>.
  super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 4;
  if (EmptyKind < a->LHSKind) {
    local_160 = Twine::toStringRef(a,(SmallVectorImpl<char> *)&a_storage);
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)&components,&local_160);
  }
  if (EmptyKind < b->LHSKind) {
    local_160 = Twine::toStringRef(b,(SmallVectorImpl<char> *)&b_storage);
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)&components,&local_160);
  }
  if (EmptyKind < c->LHSKind) {
    local_160 = Twine::toStringRef(c,(SmallVectorImpl<char> *)&c_storage);
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)&components,&local_160);
  }
  if (EmptyKind < d->LHSKind) {
    local_160 = Twine::toStringRef(d,(SmallVectorImpl<char> *)&d_storage);
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              ((SmallVectorTemplateBase<llvm::StringRef,_true> *)&components,&local_160);
  }
  bVar8 = style == windows;
  local_148 = "/";
  if (bVar8) {
    local_148 = "\\/";
  }
  uVar2 = 0x2f;
  if (bVar8) {
    uVar2 = 0x5c;
  }
  lVar7 = (components.super_SmallVectorImpl<llvm::StringRef>.
           super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
          0xffffffff) << 4;
  this = (StringRef *)
         components.super_SmallVectorImpl<llvm::StringRef>.
         super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
  do {
    if (lVar7 == 0) {
      SmallVectorImpl<llvm::StringRef>::~SmallVectorImpl
                (&components.super_SmallVectorImpl<llvm::StringRef>);
      SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&d_storage);
      SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&c_storage);
      SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&b_storage);
      SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&a_storage);
      return;
    }
    uVar5 = (path->super_SmallVectorTemplateBase<char,_true>).
            super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    if ((ulong)uVar5 == 0) {
LAB_0014b126:
      if (this->Length == 0) {
LAB_0014b14d:
        if (uVar5 != 0) {
          Twine::Twine((Twine *)&local_160,this);
          bVar4 = has_root_name((Twine *)&local_160,style);
          if (!bVar4) {
            local_160.Data._0_1_ = uVar2;
            SmallVectorTemplateBase<char,_true>::push_back
                      (&path->super_SmallVectorTemplateBase<char,_true>,(char *)&local_160);
          }
        }
      }
      else {
        cVar3 = StringRef::operator[](this,0);
        if ((cVar3 != '/') && (style != windows || cVar3 != '\\')) {
          uVar5 = (path->super_SmallVectorTemplateBase<char,_true>).
                  super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
          goto LAB_0014b14d;
        }
      }
      in_start = this->Data;
      in_end = in_start + this->Length;
    }
    else {
      cVar3 = *(char *)((long)(path->super_SmallVectorTemplateBase<char,_true>).
                              super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                              BeginX + ((ulong)uVar5 - 1));
      if ((cVar3 != '/') && (style != windows || cVar3 != '\\')) goto LAB_0014b126;
      Chars.Length = (ulong)bVar8 + 1;
      Chars.Data = local_148;
      sVar6 = StringRef::find_first_not_of(this,Chars,0);
      uVar1 = this->Length;
      if (uVar1 < sVar6) {
        sVar6 = uVar1;
      }
      in_start = this->Data + sVar6;
      in_end = this->Data + uVar1;
    }
    SmallVectorImpl<char>::append<char_const*,void>(path,in_start,in_end);
    this = this + 1;
    lVar7 = lVar7 + -0x10;
  } while( true );
}

Assistant:

void append(SmallVectorImpl<char> &path, Style style, const Twine &a,
            const Twine &b, const Twine &c, const Twine &d) {
  SmallString<32> a_storage;
  SmallString<32> b_storage;
  SmallString<32> c_storage;
  SmallString<32> d_storage;

  SmallVector<StringRef, 4> components;
  if (!a.isTriviallyEmpty()) components.push_back(a.toStringRef(a_storage));
  if (!b.isTriviallyEmpty()) components.push_back(b.toStringRef(b_storage));
  if (!c.isTriviallyEmpty()) components.push_back(c.toStringRef(c_storage));
  if (!d.isTriviallyEmpty()) components.push_back(d.toStringRef(d_storage));

  for (auto &component : components) {
    bool path_has_sep =
        !path.empty() && is_separator(path[path.size() - 1], style);
    if (path_has_sep) {
      // Strip separators from beginning of component.
      size_t loc = component.find_first_not_of(separators(style));
      StringRef c = component.substr(loc);

      // Append it.
      path.append(c.begin(), c.end());
      continue;
    }

    bool component_has_sep =
        !component.empty() && is_separator(component[0], style);
    if (!component_has_sep &&
        !(path.empty() || has_root_name(component, style))) {
      // Add a separator.
      path.push_back(preferred_separator(style));
    }

    path.append(component.begin(), component.end());
  }
}